

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
ParserValidationErrorTest_Proto2CustomJsonConflictWithDefaultError_Test::
~ParserValidationErrorTest_Proto2CustomJsonConflictWithDefaultError_Test
          (ParserValidationErrorTest_Proto2CustomJsonConflictWithDefaultError_Test *this)

{
  ParserValidationErrorTest_Proto2CustomJsonConflictWithDefaultError_Test *this_local;
  
  ~ParserValidationErrorTest_Proto2CustomJsonConflictWithDefaultError_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, Proto2CustomJsonConflictWithDefaultError) {
  ExpectParsesTo(
      "syntax = 'proto2';\n"
      "message TestMessage {\n"
      "  optional uint32 foo = 1 [json_name='bar'];\n"
      "  optional uint32 bar = 2;\n"
      "}\n",
      "syntax: 'proto2'\n"
      "message_type {\n"
      "  name: 'TestMessage'\n"
      "  field {\n"
      "    label: LABEL_OPTIONAL type: TYPE_UINT32 name: 'foo' number: 1 "
      "json_name: 'bar'\n"
      "  }\n"
      "  field {\n"
      "    label: LABEL_OPTIONAL type: TYPE_UINT32 name: 'bar' number: 2\n"
      "  }\n"
      "}\n");
}